

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_0::checkForRequiredDecoration
               (uint32_t struct_id,function<bool_(spv::Decoration)> *checker,Op type,
               ValidationState_t *vstate)

{
  _Manager_type p_Var1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  Instruction *pIVar6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  ValidationState_t *vstate_00;
  byte bVar9;
  uint32_t *puVar10;
  ValidationState_t *pVVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  void *local_78;
  void *pvStack_70;
  long local_68;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  vstate_00 = vstate;
  pIVar6 = ValidationState_t::FindDef(vstate,struct_id);
  local_78 = (void *)0x0;
  pvStack_70 = (void *)0x0;
  local_68 = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
             (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,
             (pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if (pvStack_70 != local_78) {
    pVVar11 = (ValidationState_t *)0x0;
    do {
      uVar5 = *(uint32_t *)((long)local_78 + (long)pVVar11 * 4);
      if (type == OpTypeMatrix) {
        while (pIVar6 = ValidationState_t::FindDef(vstate,uVar5),
              ((pIVar6->inst_).opcode & 0xfffe) == 0x1c) {
          uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
        }
        uVar5 = (pIVar6->inst_).result_id;
      }
      pIVar6 = ValidationState_t::FindDef(vstate,uVar5);
      bVar9 = false;
      if ((pIVar6->inst_).opcode == type) {
        local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar5;
        pmVar7 = std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&vstate->id_decorations_,(key_type *)&local_90);
        bVar9 = 0;
        for (p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = p_Var8[1]._M_color;
          if ((checker->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016e175;
          bVar3 = (*checker->_M_invoker)((_Any_data *)checker,(Decoration *)&local_90);
          if (bVar3) {
            bVar9 = 1;
          }
        }
        local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = struct_id;
        pmVar7 = std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&vstate->id_decorations_,(key_type *)&local_90);
        for (p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = p_Var8[1]._M_color;
          if ((checker->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0016e175:
            std::__throw_bad_function_call();
          }
          bVar3 = (*checker->_M_invoker)((_Any_data *)checker,(Decoration *)&local_90);
          if ((bVar3) && (p_Var8[2]._M_color == (_Rb_tree_color)pVVar11)) {
            bVar9 = 1;
          }
        }
        bVar9 = ~bVar9;
      }
      if ((bool)bVar9) {
        bVar3 = false;
        goto LAB_0016e148;
      }
      pVVar11 = (ValidationState_t *)((long)&pVVar11->context_ + 1);
      vstate_00 = (ValidationState_t *)((long)pvStack_70 - (long)local_78 >> 2);
    } while (pVVar11 < vstate_00);
  }
  getStructMembers(&local_90,struct_id,(Op)vstate,vstate_00);
  puVar10 = (uint32_t *)
            CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     (_Rb_tree_color)
                     local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  bVar3 = puVar10 ==
          local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar3) {
    do {
      uVar5 = *puVar10;
      local_48 = (_Manager_type)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      p_Var1 = (checker->super__Function_base)._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)(&local_58,(_Any_data *)checker,__clone_functor);
        p_Stack_40 = checker->_M_invoker;
        local_48 = (checker->super__Function_base)._M_manager;
      }
      bVar4 = checkForRequiredDecoration
                        (uVar5,(function<bool_(spv::Decoration)> *)&local_58,type,vstate);
      if (local_48 != (_Manager_type)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (!bVar4) break;
      puVar10 = puVar10 + 1;
      bVar3 = puVar10 ==
              local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    } while (!bVar3);
  }
  pvVar2 = (void *)CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (_Rb_tree_color)
                            local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_90.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
LAB_0016e148:
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return bVar3;
}

Assistant:

bool checkForRequiredDecoration(uint32_t struct_id,
                                std::function<bool(spv::Decoration)> checker,
                                spv::Op type, ValidationState_t& vstate) {
  const auto& members = getStructMembers(struct_id, vstate);
  for (size_t memberIdx = 0; memberIdx < members.size(); memberIdx++) {
    auto id = members[memberIdx];
    if (type == spv::Op::OpTypeMatrix) {
      // Matrix decorations also apply to arrays of matrices.
      auto memberInst = vstate.FindDef(id);
      while (memberInst->opcode() == spv::Op::OpTypeArray ||
             memberInst->opcode() == spv::Op::OpTypeRuntimeArray) {
        memberInst = vstate.FindDef(memberInst->GetOperandAs<uint32_t>(1u));
      }
      id = memberInst->id();
    }
    if (type != vstate.FindDef(id)->opcode()) continue;
    bool found = false;
    for (auto& dec : vstate.id_decorations(id)) {
      if (checker(dec.dec_type())) found = true;
    }
    for (auto& dec : vstate.id_decorations(struct_id)) {
      if (checker(dec.dec_type()) &&
          (int)memberIdx == dec.struct_member_index()) {
        found = true;
      }
    }
    if (!found) {
      return false;
    }
  }
  for (auto id : getStructMembers(struct_id, spv::Op::OpTypeStruct, vstate)) {
    if (!checkForRequiredDecoration(id, checker, type, vstate)) {
      return false;
    }
  }
  return true;
}